

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O2

int __thiscall
CVmObjFrameDesc::find_local(CVmObjFrameDesc *this,vm_val_t *nval,CVmDbgFrameSymPtr *symp)

{
  int iVar1;
  ushort *puVar2;
  
  puVar2 = (ushort *)vm_val_t::get_as_string(nval);
  if (puVar2 != (ushort *)0x0) {
    iVar1 = find_local(this,(textchar_t *)(puVar2 + 1),(ulong)*puVar2,symp);
    return iVar1;
  }
  err_throw(0x900);
}

Assistant:

int CVmObjFrameDesc::find_local(VMG_ const vm_val_t *nval,
                               CVmDbgFrameSymPtr *symp)
{
    /* make sure the name is a string */
    const char *name = nval->get_as_string(vmg0_);
    if (name == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* parse the length */
    size_t namelen = vmb_get_len(name);
    name += VMB_LEN;

    /* look up the symbol */
    return find_local(vmg_ name, namelen, symp);
}